

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O1

Value * evaluate_expression(Scope *scope,Expression *expression)

{
  bool bVar1;
  Value *pVVar2;
  Variable *pVVar3;
  Value *pVVar4;
  Literal *__nmemb;
  byte *pbVar5;
  FunctionExpression *function_expression;
  
  switch(expression->expression_type) {
  default:
switchD_00107732_caseD_0:
    pVVar4 = new_null_value();
    return pVVar4;
  case ExpressionTypeIntegerExpression:
    pVVar4 = new_integer_value_from_literal((IntegerLiteral *)expression->literal);
    return pVVar4;
  case ExpressionTypeFloatExpression:
    pVVar4 = new_float_value_from_literal((FloatLiteral *)expression->literal);
    return pVVar4;
  case ExpressionTypeStringExpression:
    pVVar4 = new_string_value_from_literal((StringLiteral *)expression->literal);
    return pVVar4;
  case ExpressionTypeBoolExpression:
    pVVar4 = new_bool_value(SUB41(expression->literal[1].literal_type,0));
    return pVVar4;
  case ExpressionTypeIdentifierExpression:
    goto switchD_00107732_caseD_5;
  case ExpressionTypeInfixExpression:
    pVVar4 = evaluate_infix_expression(scope,(InfixExpression *)expression);
    return pVVar4;
  case ExpressionTypePrefixExpression:
    pVVar4 = evaluate_prefix_expression(scope,(PrefixExpression *)expression);
    return pVVar4;
  case ExpressionTypeCallExpression:
    pVVar4 = evaluate_call_expression(scope,(CallExpression *)expression);
    return pVVar4;
  case ExpressionTypeArrayExpression:
    break;
  case ExpressionTypeIndexExpression:
    pVVar4 = _evaluate_or_apply_index_operation(scope,(IndexExpression *)expression,(Value *)0x0);
    return pVVar4;
  case ExpressionTypeFunctionExpression:
    pVVar4 = new_function_value(*(Block **)(expression + 1),*(char ***)(expression + 2),
                                (size_t)expression[2].literal);
    if (expression[1].literal == (Literal *)0x0) {
      return pVVar4;
    }
    scope_set_variable(scope,ValueTypeNullValue,*(char **)(*(long *)(expression[1].literal + 2) + 8)
                       ,pVVar4,0);
    return pVVar4;
  }
  __nmemb = expression[1].literal;
  pVVar4 = (Value *)calloc((size_t)__nmemb,8);
  if (__nmemb != (Literal *)0x0) {
    pbVar5 = (byte *)0x0;
    do {
      pVVar2 = evaluate_expression(scope,*(Expression **)
                                          (*(long *)(expression + 1) + (long)pbVar5 * 8));
      *(Value **)(&pVVar4->value_type + (long)pbVar5 * 2) = pVVar2;
      pVVar2->linked_variable_count = pVVar2->linked_variable_count + 1;
      pbVar5 = pbVar5 + 1;
      __nmemb = expression[1].literal;
    } while (pbVar5 < __nmemb);
  }
  if (expression[2].expression_type == ExpressionTypeIntegerExpression) {
    pVVar4 = new_list_value((Value **)pVVar4,(size_t)__nmemb,(_Bool)expression[2].field_0x4);
LAB_0010788b:
    bVar1 = false;
  }
  else {
    if (expression[2].expression_type == ExpressionTypeFloatExpression) {
      pVVar4 = new_tuple_value((Value **)pVVar4,(size_t)__nmemb,(_Bool)expression[2].field_0x4);
      goto LAB_0010788b;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return pVVar4;
  }
switchD_00107732_caseD_5:
  pVVar3 = scope_get_variable(scope,ValueTypeNullValue,*(char **)(expression->literal + 2));
  if (pVVar3 != (Variable *)0x0) {
    return pVVar3->value;
  }
  goto switchD_00107732_caseD_0;
}

Assistant:

Value *evaluate_expression(Scope *scope, Expression *expression) {
  switch (expression->expression_type) {
    case ExpressionTypeNullExpression: {
      return new_null_value();
    }

    case ExpressionTypeBoolExpression: {
      return new_bool_value(((BoolLiteral *) expression->literal)->bool_literal);
    }

    case ExpressionTypeIntegerExpression: {
      return new_integer_value_from_literal((IntegerLiteral *) expression->literal);
    }

    case ExpressionTypeFloatExpression: {
      return new_float_value_from_literal((FloatLiteral *) expression->literal);
    }

    case ExpressionTypeStringExpression: {
      return new_string_value_from_literal((StringLiteral *) expression->literal);
    }

    case ExpressionTypeInfixExpression: {
      return evaluate_infix_expression(scope, (InfixExpression *) expression);
    }

    case ExpressionTypePrefixExpression: {
      return evaluate_prefix_expression(scope, (PrefixExpression *) expression);
    }

    case ExpressionTypeIndexExpression: {
      IndexExpression *index_expression = (IndexExpression *) expression;

      return evaluate_index_expression(scope, index_expression);
    }

    case ExpressionTypeArrayExpression: {
      ArrayExpression *array_expression = (ArrayExpression *) expression;

      Value **items = calloc(array_expression->expression_count, sizeof(Value *));

      for (size_t i = 0; i < array_expression->expression_count; i++) {
        items[i] = evaluate_expression(scope, array_expression->expressions[i]);
        items[i]->linked_variable_count++;
      }

      if (array_expression->array_expression_type == ArrayExpressionTypeTuple) {
        return new_tuple_value(items, array_expression->expression_count, array_expression->has_finished);
      }
      else if (array_expression->array_expression_type == ArrayExpressionTypeList) {
        return new_list_value(items, array_expression->expression_count, array_expression->has_finished);
      }
    }

    case ExpressionTypeIdentifierExpression: {
      StringLiteral *string_literal = (StringLiteral *) expression->literal;

      Variable *variable = scope_get_variable(scope, ValueTypeNullValue, string_literal->string_literal);

      if (variable == NULL) {
        return new_null_value();
      }

      return variable->value;
    }

    case ExpressionTypeCallExpression: {
      return evaluate_call_expression(scope, (CallExpression *) expression);
    }

    case ExpressionTypeFunctionExpression: {
      FunctionExpression *function_expression = (FunctionExpression *) expression;

      FunctionValue *function_value = (FunctionValue *) new_function_value(function_expression->block, function_expression->arguments, function_expression->argument_count);

      if (function_expression->identifier != NULL) {
        char *function_name = ((StringLiteral *) function_expression->identifier->literal)->string_literal;

        scope_set_variable(scope, ValueTypeNullValue, function_name, (Value *) function_value, false);
      }

      return (Value *) function_value;
    }
  }

  return new_null_value();
}